

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static.hpp
# Opt level: O3

int __thiscall
multidim::
MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
::offset(MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
         *this,initializer_list<int> *L)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if (L->_M_len == 4) {
    auVar1 = *(undefined1 (*) [16])L->_M_array;
    auVar2._8_4_ = 1;
    auVar2._0_8_ = 0x3800000038;
    auVar2._12_4_ = 1;
    return (int)((auVar2._8_8_ & 0xffffffff) * (ulong)auVar1._12_4_) + auVar1._4_4_ * 0x38 +
           (int)((auVar1._8_8_ & 0xffffffff) * 8) + auVar1._0_4_ * 0x150;
  }
  __assert_fail("L.size() == Ncount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eruffaldi[P]multidimcxx/multidim_static.hpp"
                ,0x58,
                "int multidim::MultiDimNBase<double, multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>>::offset(const std::initializer_list<int> &) const [T = double, TS = multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>]"
               );
}

Assistant:

int offset(const std::initializer_list<int> & L) const 
		{	
			assert(L.size() == Ncount); //,"wrong number of dims");
			auto x = L.begin(); /// C++14 constexpr
			int o = 0;
			for(int i = 0; i < Ncount; x++, i++)
				o += *x *getstep(i);
			return o;
		}